

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O0

void __thiscall VariablePattern::advance(VariablePattern *this,int t)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_18;
  uint i;
  int t_local;
  VariablePattern *this_local;
  
  local_18 = (this->super_Pattern).currentIndex;
  do {
    uVar1 = local_18;
    local_18 = uVar1 + 1;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->times);
    if (sVar2 <= local_18) {
      sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->times);
      (this->super_Pattern).currentIndex = (int)sVar2 + -1;
      return;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&this->times,(ulong)local_18);
  } while (*pvVar3 <= t);
  (this->super_Pattern).currentIndex = uVar1;
  return;
}

Assistant:

void VariablePattern::advance(int t)
{
    for (unsigned int i = currentIndex+1; i < times.size(); i++)
    {
        if ( t < times[i] )
        {
            currentIndex = i-1;
            return;
        }
    }
    currentIndex = times.size() - 1;
}